

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vocab.c
# Opt level: O2

int vocgtyp(voccxdef *ctx,char **cmd,int *types,char *orgbuf)

{
  uint uVar1;
  size_t sVar2;
  int checktyp;
  char **ppcVar3;
  char cVar4;
  int iVar5;
  char *__dest;
  char *__s;
  long lVar6;
  long lVar7;
  char *pcVar8;
  ulong __n;
  int *piVar9;
  int local_1c0;
  char redobuf [200];
  char oopsbuf [128];
  
  local_1c0 = 0;
LAB_001f5f85:
  if ((ctx->voccxflg & 4) != 0) {
    outformat(". Checking words:\\n");
  }
  lVar6 = 0;
  do {
    pcVar8 = cmd[lVar6];
    if (pcVar8 == (char *)0x0) {
      ctx->voccxunknown = local_1c0;
      ctx->voccxlastunk = local_1c0;
      return 0;
    }
    sVar2 = strlen(pcVar8);
    uVar1 = voc_lookup_type(ctx,pcVar8,(int)sVar2,0);
    if (uVar1 == 0) {
      iVar5 = voc_check_special(ctx,pcVar8,checktyp);
      uVar1 = 0;
      if (iVar5 == 0) {
        if ((ctx->voccxunknown != 0) &&
           (uVar1 = ctx->voccxlastunk - ctx->voccxunknown, (int)uVar1 <= local_1c0)) break;
        local_1c0 = local_1c0 + 1;
        uVar1 = 0x80;
      }
    }
    if ((ctx->voccxflg & 4) != 0) {
      outshow();
      sprintf(redobuf,"... %s (",cmd[lVar6]);
      sVar2 = strlen(redobuf);
      pcVar8 = redobuf + sVar2;
      piVar9 = &type_names_rel;
      iVar5 = 0;
      for (lVar7 = 0; lVar7 != 8; lVar7 = lVar7 + 1) {
        if ((uVar1 >> ((uint)lVar7 & 0x1f) & 1) != 0) {
          if (iVar5 != 0) {
            *pcVar8 = ',';
            pcVar8 = pcVar8 + 1;
          }
          strcpy(pcVar8,(char *)((long)&type_names_rel + (long)*piVar9));
          sVar2 = strlen(pcVar8);
          pcVar8 = pcVar8 + sVar2;
          iVar5 = iVar5 + 1;
        }
        piVar9 = piVar9 + 1;
      }
      builtin_strncpy(pcVar8,")\\n",4);
      outformat(redobuf);
    }
    types[lVar6] = uVar1;
    lVar6 = lVar6 + 1;
  } while( true );
  ctx->voccxunknown = 0;
  pcVar8 = voc_read_oops(ctx,oopsbuf,(size_t)pcVar8,(char *)(ulong)uVar1);
  if (pcVar8 == (char *)0x0) {
    strcpy(orgbuf,oopsbuf);
    ctx->voccxunknown = 0;
    ctx->voccxredo = 1;
    return 1;
  }
  iVar5 = 0;
  __dest = redobuf;
  for (ppcVar3 = cmd; __s = *ppcVar3, __s != (char *)0x0; ppcVar3 = ppcVar3 + 1) {
    if (iVar5 == (int)lVar6) {
      __n = 0;
      while ((0x3f < (ulong)(byte)pcVar8[__n] ||
             (__s = pcVar8, (0x8000500200000001U >> ((ulong)(byte)pcVar8[__n] & 0x3f) & 1) == 0))) {
        __n = __n + 1;
      }
LAB_001f616f:
      memcpy(__dest,__s,__n);
    }
    else {
      if (*__s != '\"') {
        sVar2 = strlen(__s);
        __n = (ulong)(int)sVar2;
        goto LAB_001f616f;
      }
      __n = (ulong)*(ushort *)(__s + 1);
      for (lVar7 = 0; (int)(__n - 2) != (int)lVar7; lVar7 = lVar7 + 1) {
        if ((__s + 3)[lVar7] == '\"') {
          cVar4 = '\'';
          goto LAB_001f6182;
        }
      }
      cVar4 = '\"';
LAB_001f6182:
      *__dest = cVar4;
      memcpy(__dest + 1,__s + 3,__n - 2);
      __dest[__n - 1] = cVar4;
    }
    __dest[__n] = ' ';
    __dest = __dest + __n + 1;
    iVar5 = iVar5 + 1;
  }
  *__dest = '\0';
  **cmd = '\0';
  uVar1 = voctok(ctx,redobuf,*cmd,cmd,0,0,1);
  if ((int)uVar1 < 1) {
    return 1;
  }
  cmd[uVar1] = (char *)0x0;
  goto LAB_001f5f85;
}

Assistant:

int vocgtyp(voccxdef *ctx, char *cmd[], int types[], char *orgbuf)
{
    int      cur;
    int      t;
    char    *p;
    int      len;
    int      unknown_count = 0;
    
startover:
    if (ctx->voccxflg & VOCCXFDBG)
        tioputs(ctx->vocxtio, ". Checking words:\\n");

    for (cur = 0 ; cmd[cur] ; ++cur)
    {
        /* get the word */
        p = cmd[cur];
        len = strlen(p);

        /* look it up */
        t = voc_lookup_type(ctx, p, len, FALSE);
        
        /* see if the word was found */
        if (t == 0 && !voc_check_special(ctx, p, VOCW_OF))
        {
            /* 
             *   We didn't find the word.  For now, set its type to
             *   "unknown".
             */
            t = VOCT_UNKNOWN;

            /*
             *   If the unknown word count is already non-zero, it means
             *   that we've tried to let the game resolve this word using
             *   the parseUnknownDobj/Iobj mechanism, but it wasn't able
             *   to do so, thus we've come back here to use the normal
             *   "oops" processing instead.
             *   
             *   Don't generate a message until we get to the first
             *   unknown word from the original list that we weren't able
             *   to resolve.  We may have been able to handle one or more
             *   of the original list of unknown words (through
             *   parseNounPhrase or other means), so we don't want to
             *   generate a message for any words we ended up handling.
             *   The number we resolved is the last full unknown count
             *   minus the remaining unknown count.  
             */
            if (ctx->voccxunknown != 0
                && unknown_count >= ctx->voccxlastunk - ctx->voccxunknown)
            {
                char  oopsbuf[VOCBUFSIZ];
                char *p1;
                
                /* 
                 *   we can try using the parseUnknownDobj/Iobj again
                 *   after this, so clear the unknown word count for now
                 */
                ctx->voccxunknown = 0;

                /* display an error, and ask for a new command */
                p1 = voc_read_oops(ctx, oopsbuf, sizeof(oopsbuf), p);

                /* if they responded with replacement text, apply it */
                if (p1 != 0)
                {
                    char   redobuf[200];
                    char  *q;
                    int    i;
                    int    wc;
                    char **w;
                    char  *outp;
                    
                    /* 
                     *   copy words from the original string, replacing
                     *   the unknown word with what follows the "oops" in
                     *   the new command 
                     */
                    for (outp = redobuf, i = 0, w = cmd ; *w != 0 ; ++i, ++w)
                    {
                        
                        /* see what we have */
                        if (i == cur)
                        {
                            /* 
                             *   We've reached the word to be replaced.
                             *   Ignore the original token, and replace it
                             *   with the word or words from the OOPS
                             *   command 
                             */
                            for (q = p1, len = 0 ;
                                 *q != '\0' && *q != '.' && *q != ','
                                     && *q != '?' && *q != '!' ; ++q, ++len) ;
                            memcpy(outp, p1, (size_t)len);
                            outp += len;
                        }
                        else if (**w == '"')
                        {
                            char *strp;
                            char *p2;
                            char qu;
                            int rem;

                            /* 
                             *   It's a string - add a quote mark, then
                             *   copy the string as indicated by the
                             *   length prefix, then add another quote
                             *   mark.  Get the length by reading the
                             *   length prefix following the quote mark,
                             *   and get a pointer to the text of the
                             *   string, which immediately follows the
                             *   length prefix.  
                             */
                            len = osrp2(*w + 1) - 2;
                            strp = *w + 3;

                            /*
                             *   We need to figure out what kind of quote
                             *   mark to use.  If the string contains any
                             *   embedded double quotes, use single quotes
                             *   to delimit the string; otherwise, use
                             *   double quotes.  Presume we'll use double
                             *   quotes as the delimiter, then scan the
                             *   string for embedded double quotes.  
                             */
                            for (qu = '"', p2 = strp, rem = len ; rem != 0 ;
                                 --rem, ++p2)
                            {
                                /* 
                                 *   if this is an embedded double quote,
                                 *   use single quotes to delimite the
                                 *   string 
                                 */
                                if (*p2 == '"')
                                {
                                    /* use single quotes as delimiters */
                                    qu = '\'';

                                    /* no need to look any further */
                                    break;
                                }
                            }

                            /* add the open quote */
                            *outp++ = qu;

                            /* copy the string */
                            memcpy(outp, strp, len);
                            outp += len;

                            /* add the close quote */
                            *outp++ = qu;
                        }
                        else
                        {
                            /* 
                             *   it's an ordinary token - copy the
                             *   null-terminated string for the token from
                             *   the original command list 
                             */
                            len = strlen(*w);
                            memcpy(outp, *w, (size_t)len);
                            outp += len;
                        }

                        /* add a space between words */
                        *outp++ = ' ';
                    }
                    
                    /* terminate the new string */
                    *outp = '\0';
                    
                    /* try tokenizing the string */
                    *(cmd[0]) = '\0';
                    if ((wc = voctok(ctx, redobuf, cmd[0],
                                     cmd, FALSE, FALSE, TRUE)) <= 0)
                        return 1;
                    cmd[wc] = 0;

                    /* start over with the typing */
                    goto startover;
                }
                else
                {
                    /* 
                     *   They didn't start the command with "oops", so
                     *   this must be a brand new command.  Replace the
                     *   original command with the new command.  
                     */
                    strcpy(orgbuf, oopsbuf);

                    /* 
                     *   forget we had an unknown word so that we're sure
                     *   to start over with a new command 
                     */
                    ctx->voccxunknown = 0;
                    
                    /* 
                     *   set the "redo" flag to start over with the new
                     *   command 
                     */
                    ctx->voccxredo = 1;
                    
                    /* 
                     *   return an error to indicate the current command
                     *   has been aborted 
                     */
                    return 1;
                }
            }
            else
            {
                /*
                 *   We've now encountered an unknown word, and we're
                 *   going to defer resolution.  Remember this; we'll
                 *   count the unknown word in the context when we return
                 *   (do so only locally for now, since we may encounter
                 *   more unknown words before we return, in which case we
                 *   want to know that this is still the first pass).  
                 */
                ++unknown_count;
            }
        }

        /* display if in debug mode */
        if (ctx->voccxflg & VOCCXFDBG)
        {
            char    buf[128];
            size_t  i;
            char   *p;
            int     cnt;
            
            (void)tioshow(ctx->voccxtio);
            sprintf(buf, "... %s (", cmd[cur]);
            p = buf + strlen(buf);
            cnt = 0;
            for (i = 0 ; i < sizeof(type_names)/sizeof(type_names[0]) ; ++i)
            {
                if (t & (1 << i))
                {
                    if (cnt) *p++ = ',';
                    strcpy(p, type_names[i]);
                    p += strlen(p);
                    ++cnt;
                }
            }
            *p++ = ')';
            *p++ = '\\';
            *p++ = 'n';
            *p = '\0';
            tioputs(ctx->voccxtio, buf);
        }
        
        types[cur] = t;                         /* record type of this word */
    }

    /* if we found any unknown words, note this in our context */
    ctx->voccxunknown = unknown_count;
    ctx->voccxlastunk = unknown_count;
    
    /* successful acquisition of types */
    return 0;
}